

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

string * __thiscall
kws::Parser::FindPreviousWord
          (string *__return_storage_ptr__,Parser *this,size_t pos,bool withComments,string *buffer)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  string stream;
  string store;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70[0] = local_60;
  pcVar1 = (buffer->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + buffer->_M_string_length);
  if ((buffer->_M_string_length == 0) &&
     (std::__cxx11::string::_M_assign((string *)local_70), withComments)) {
    std::__cxx11::string::_M_assign((string *)local_70);
  }
  cVar2 = local_70[0][pos];
  if (cVar2 == ' ') {
    bVar7 = false;
  }
  else {
    do {
      if ((pos == 0) || (cVar2 == '\r')) break;
      cVar2 = local_70[0][pos - 1];
      pos = pos - 1;
    } while (cVar2 != ' ');
    bVar7 = cVar2 == '\r';
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  lVar5 = pos - (byte)(1 < pos & bVar7);
  if (lVar5 != -1) {
    bVar3 = true;
    bVar7 = true;
    bVar4 = false;
    do {
      cVar2 = local_70[0][lVar5];
      if (cVar2 == '\n') {
LAB_0012307a:
        bVar7 = bVar3;
        if (bVar4) {
          bVar7 = false;
          bVar3 = bVar7;
        }
      }
      else if (cVar2 != '\r') {
        if (cVar2 == ' ') goto LAB_0012307a;
        pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        bVar4 = true;
        bVar7 = true;
        bVar3 = true;
      }
      bVar6 = lVar5 != 0;
      lVar5 = lVar5 + -1;
    } while ((bVar6) && (bVar7));
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindPreviousWord(size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  size_t i=pos;

  while(stream[i] != ' ' && stream[i] != '\r' && i>0)
    {
    i--;
    }

  if(stream[i] == '\r' && i>1)
    {
    i--;
    }

  bool inWord = true;
  bool first = false;
  std::string ivar = "";
  while(i != std::string::npos && inWord)
    {
    if(stream[i] != ' ' && stream[i] != '\n' && stream[i] != '\r')
      {
      std::string store = ivar;
      ivar = stream[i];
      ivar += store;
      inWord = true;
      first = true;
      }
    else // we have a space
      {
      if(stream[i] == '\r')
        {
        // do nothing
        }
      else if(first)
        {
        inWord = false;
        }
      }
    i--;
    }
  return ivar;
}